

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlaceTiles.cpp
# Opt level: O2

void __thiscall commands::PlaceTiles::undo(PlaceTiles *this)

{
  long lVar1;
  size_t index;
  Tile TStack_58;
  Tile local_40;
  
  index = this->lastExecuteSize_;
  lVar1 = index * 8;
  while( true ) {
    index = index - 1;
    if (index == 0xffffffffffffffff) break;
    accessTile(&local_40,this,index);
    Board::accessTile(&TStack_58,this->board_,
                      (Vector2i *)
                      ((long)&(this->tilePositions_).
                              super__Vector_base<sf::Vector2<int>,_std::allocator<sf::Vector2<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[-1].x + lVar1));
    Tile::swapWith(&local_40,&TStack_58);
    lVar1 = lVar1 + -8;
  }
  this->lastExecuteSize_ = 0;
  return;
}

Assistant:

void PlaceTiles::undo() {
    for (size_t i = lastExecuteSize_; i > 0; --i) {
        accessTile(i - 1).swapWith(board_.accessTile(tilePositions_[i - 1]));
    }
    lastExecuteSize_ = 0;
}